

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O0

uint decode_gamma(png_image_read_control *display,png_uint_32 value,int encoding)

{
  png_uint_16 pVar1;
  int local_18;
  uint local_14;
  int encoding_local;
  png_uint_32 value_local;
  png_image_read_control *display_local;
  
  local_18 = encoding;
  if (encoding == 3) {
    local_18 = display->file_encoding;
  }
  if (local_18 == 0) {
    set_file_encoding(display);
    local_18 = display->file_encoding;
  }
  switch(local_18) {
  case 1:
    local_14 = (uint)png_sRGB_table[value];
    break;
  case 2:
    local_14 = value;
    break;
  case 3:
    pVar1 = png_gamma_16bit_correct(value * 0x101,display->gamma_to_linear);
    local_14 = (uint)pVar1;
    break;
  case 4:
    local_14 = value * 0x101;
    break;
  default:
    png_error(display->image->opaque->png_ptr,"unexpected encoding (internal error)");
  }
  return local_14;
}

Assistant:

static unsigned int
decode_gamma(png_image_read_control *display, png_uint_32 value, int encoding)
{
   if (encoding == P_FILE) /* double check */
      encoding = display->file_encoding;

   if (encoding == P_NOTSET) /* must be the file encoding */
   {
      set_file_encoding(display);
      encoding = display->file_encoding;
   }

   switch (encoding)
   {
      case P_FILE:
         value = png_gamma_16bit_correct(value*257, display->gamma_to_linear);
         break;

      case P_sRGB:
         value = png_sRGB_table[value];
         break;

      case P_LINEAR:
         break;

      case P_LINEAR8:
         value *= 257;
         break;

#ifdef __GNUC__
      default:
         png_error(display->image->opaque->png_ptr,
             "unexpected encoding (internal error)");
#endif
   }

   return value;
}